

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void gola_resolve(LexState *ls,FuncScope *bl,MSize idx)

{
  uint uVar1;
  uint uVar2;
  VarInfo *vg;
  VarInfo *vl;
  
  vg = ls->vstack + bl->vstart;
  vl = ls->vstack + idx;
  do {
    if (vl <= vg) {
      return;
    }
    uVar1 = (vg->name).gcptr32;
    if ((uVar1 == (vl->name).gcptr32) && ((vg->info & 2) != 0)) {
      if (vg->slot < vl->slot) {
        uVar2 = ls->vstack[ls->fs->varmap[vg->slot]].name.gcptr32;
        ls->linenumber = ls->fs->bcbase[vg->startpc].line;
        lj_lex_error(ls,0,LJ_ERR_XGSCOPE,(ulong)uVar1 + 0x10,(ulong)uVar2 + 0x10);
      }
      gola_patch(ls,vg,vl);
    }
    vg = vg + 1;
  } while( true );
}

Assistant:

static void gola_resolve(LexState *ls, FuncScope *bl, MSize idx)
{
  VarInfo *vg = ls->vstack + bl->vstart;
  VarInfo *vl = ls->vstack + idx;
  for (; vg < vl; vg++)
    if (gcrefeq(vg->name, vl->name) && gola_isgoto(vg)) {
      if (vg->slot < vl->slot) {
	GCstr *name = strref(var_get(ls, ls->fs, vg->slot).name);
	lj_assertLS((uintptr_t)name >= VARNAME__MAX, "expected goto name");
	ls->linenumber = ls->fs->bcbase[vg->startpc].line;
	lj_assertLS(strref(vg->name) != NAME_BREAK, "unexpected break");
	lj_lex_error(ls, 0, LJ_ERR_XGSCOPE,
		     strdata(strref(vg->name)), strdata(name));
      }
      gola_patch(ls, vg, vl);
    }
}